

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

EVP_PKEY * EVP_parse_public_key(CBS *cbs)

{
  int iVar1;
  EVP_PKEY_ASN1_METHOD *method;
  EVP_PKEY *pkey;
  EVP_PKEY *pEVar2;
  int line;
  EVP_PKEY *pEVar3;
  uint8_t padding;
  CBS spki;
  CBS key;
  CBS algorithm;
  uint8_t local_41;
  CBS local_40;
  CBS local_30;
  CBS local_20;
  
  iVar1 = CBS_get_asn1(cbs,&local_40,0x20000010);
  if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&local_40,&local_20,0x20000010), iVar1 == 0)) ||
      (iVar1 = CBS_get_asn1(&local_40,&local_30,3), iVar1 == 0)) || (local_40.len != 0)) {
    iVar1 = 0x66;
    line = 0x40;
  }
  else {
    method = parse_key_type(&local_20);
    if (method == (EVP_PKEY_ASN1_METHOD *)0x0) {
      iVar1 = 0x80;
      line = 0x45;
    }
    else {
      iVar1 = CBS_get_u8(&local_30,&local_41);
      if ((iVar1 != 0) && (local_41 == '\0')) {
        pkey = EVP_PKEY_new();
        pEVar3 = pkey;
        if (pkey == (EVP_PKEY *)0x0) {
          pEVar2 = (EVP_PKEY *)0x0;
        }
        else {
          evp_pkey_set_method((EVP_PKEY *)pkey,method);
          if (*(code **)(pkey->ameth + 0x18) == (code *)0x0) {
            ERR_put_error(6,0,0x80,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                          ,0x59);
            pEVar2 = (EVP_PKEY *)0x0;
          }
          else {
            iVar1 = (**(code **)(pkey->ameth + 0x18))(pkey,&local_20,&local_30);
            pEVar2 = pkey;
            pEVar3 = (EVP_PKEY *)0x0;
            if (iVar1 == 0) {
              pEVar2 = (EVP_PKEY *)0x0;
              pEVar3 = pkey;
            }
          }
        }
        if (pEVar3 == (EVP_PKEY *)0x0) {
          return (EVP_PKEY *)pEVar2;
        }
        EVP_PKEY_free(pEVar3);
        return (EVP_PKEY *)pEVar2;
      }
      iVar1 = 0x66;
      line = 0x4c;
    }
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                ,line);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_parse_public_key(CBS *cbs) {
  // Parse the SubjectPublicKeyInfo.
  CBS spki, algorithm, key;
  uint8_t padding;
  if (!CBS_get_asn1(cbs, &spki, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &key, CBS_ASN1_BITSTRING) ||
      CBS_len(&spki) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (// Every key type defined encodes the key as a byte string with the same
      // conversion to BIT STRING.
      !CBS_get_u8(&key, &padding) ||
      padding != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific SPKI decoding function.
  if (ret->ameth->pub_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->pub_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}